

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__copyval(int channel,stbi_uc *dest,stbi_uc *src)

{
  int i;
  int mask;
  stbi_uc *src_local;
  stbi_uc *dest_local;
  int channel_local;
  
  mask = 0x80;
  for (i = 0; i < 4; i = i + 1) {
    if ((channel & mask) != 0) {
      dest[i] = src[i];
    }
    mask = mask >> 1;
  }
  return;
}

Assistant:

static void stbi__copyval(int channel,stbi_uc *dest,const stbi_uc *src)
{
   int mask=0x80,i;

   for (i=0;i<4; ++i, mask>>=1)
      if (channel&mask)
         dest[i]=src[i];
}